

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::
ParseGroup<google::protobuf::internal::WireFormat::MessageSetParser>
          (ParseContext *this,MessageSetParser *msg,char *ptr,uint32_t tag)

{
  bool bVar1;
  int iVar2;
  uint32_t tag_local;
  char *ptr_local;
  MessageSetParser *msg_local;
  ParseContext *this_local;
  
  iVar2 = this->depth_ + -1;
  this->depth_ = iVar2;
  if (iVar2 < 0) {
    this_local = (ParseContext *)0x0;
  }
  else {
    this->group_depth_ = this->group_depth_ + 1;
    this_local = (ParseContext *)WireFormat::MessageSetParser::_InternalParse(msg,ptr,this);
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this->super_EpsCopyInputStream,tag);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_local = (ParseContext *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      T* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    ptr = msg->_InternalParse(ptr, this);
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }